

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O3

void __thiscall
t_go_generator::generate_go_equals_struct
          (t_go_generator *this,ostream *out,t_type *ttype,string *tgt,string *src)

{
  ostream *poVar1;
  string local_48;
  
  t_generator::indent_abi_cxx11_(&local_48,&this->super_t_generator);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"if !",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(tgt->_M_dataplus)._M_p,tgt->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->equals_method_name_)._M_dataplus._M_p,
                      (this->equals_method_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(src->_M_dataplus)._M_p,src->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") { return false }",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_go_generator::generate_go_equals_struct(ostream& out,
                                               t_type* ttype,
                                               string tgt,
                                               string src) {
  (void)ttype;
  out << indent() << "if !" << tgt << "." << equals_method_name_ << "(" << src
      << ") { return false }" << endl;
}